

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  Expression *pEVar5;
  undefined8 uVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  long lVar10;
  ulong capacity;
  long lVar11;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pSVar8 = (pointer)detail::allocArray(capacity,0x18);
  *(_Optional_payload_base<unsigned_int> *)((long)pSVar8 + lVar11 + 0x10) =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pEVar5 = args->withExpr;
  *(undefined8 *)((long)pSVar8 + lVar11) = (args->operand).ptr;
  ((undefined8 *)((long)pSVar8 + lVar11))[1] = pEVar5;
  pSVar9 = this->data_;
  sVar3 = this->len;
  pSVar7 = pSVar8;
  if (pSVar9 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)
         ((long)&(pSVar8->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                 _M_payload.super__Optional_payload_base<unsigned_int>._M_payload + lVar10) =
             *(undefined8 *)
              ((long)&(pSVar9->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                      _M_payload.super__Optional_payload_base<unsigned_int>._M_payload + lVar10);
        puVar4 = (undefined8 *)((long)&(pSVar9->operand).ptr + lVar10);
        uVar6 = puVar4[1];
        puVar1 = (undefined8 *)((long)&(pSVar8->operand).ptr + lVar10);
        *puVar1 = *puVar4;
        puVar1[1] = uVar6;
        lVar10 = lVar10 + 0x18;
      } while (sVar3 * 0x18 != lVar10);
    }
  }
  else {
    for (; pSVar9 != pos; pSVar9 = pSVar9 + 1) {
      (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (pSVar9->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar5 = pSVar9->withExpr;
      (pSVar7->operand).ptr = (pSVar9->operand).ptr;
      pSVar7->withExpr = pEVar5;
      pSVar7 = pSVar7 + 1;
    }
    sVar3 = this->len;
    pSVar9 = this->data_;
    if (pSVar9 + sVar3 != pos) {
      puVar4 = (undefined8 *)(lVar11 + (long)pSVar8);
      do {
        *(_Optional_payload_base<unsigned_int> *)(puVar4 + 5) =
             (pos->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        pEVar5 = pos->withExpr;
        puVar4[3] = (pos->operand).ptr;
        puVar4[4] = pEVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 3;
      } while (pos != pSVar9 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar8;
  return (pointer)((long)pSVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}